

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  EVP_PKEY_CTX *ctx;
  double dVar2;
  undefined1 local_260 [8];
  Word2vec word2vec;
  char *tempArg;
  int binary;
  int minCount;
  int iter;
  int threads;
  int negative;
  int hs;
  int cbow;
  int window;
  float lr;
  int embeddingSize;
  char output [200];
  EVP_PKEY_CTX local_e8 [8];
  char trainFile [200];
  char **argv_local;
  int argc_local;
  
  local_e8[0] = (EVP_PKEY_CTX)0x0;
  lr._0_1_ = 0;
  window = 0x80;
  cbow = 0x3d4ccccd;
  hs = 5;
  negative = 1;
  threads = 0;
  iter = 10;
  minCount = 1;
  binary = 5;
  tempArg._4_4_ = 5;
  tempArg._0_4_ = 0;
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-size",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    window = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-lr",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    dVar2 = atof((char *)word2vec.outputLayer);
    cbow = (int)(float)dVar2;
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-train",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    strcpy((char *)local_e8,(char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-window",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    hs = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-cbow",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    negative = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-hs",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    threads = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-negative",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    iter = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-threads",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    minCount = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-iter",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    binary = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-output",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    strcpy((char *)&lr,(char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-min-count",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    tempArg._4_4_ = atoi((char *)word2vec.outputLayer);
  }
  word2vec.outputLayer = (OutputLayer<float> *)parseArg("-binary",argc,argv);
  if (word2vec.outputLayer != (OutputLayer<float> *)0x0) {
    tempArg._0_4_ = atoi((char *)word2vec.outputLayer);
  }
  sVar1 = strlen((char *)local_e8);
  if (sVar1 == 0) {
    printf("no input file\n");
  }
  else {
    sVar1 = strlen((char *)&lr);
    if (sVar1 == 0) {
      printf("no output file\n");
    }
    else {
      ctx = local_e8;
      printf("input file: %s\n");
      printf("output file: %s\n",&lr);
      Word2vec::Word2vec((Word2vec *)local_260,window,negative,threads,hs,iter);
      Word2vec::buildVocab((Word2vec *)local_260,(char *)ctx,tempArg._4_4_);
      Word2vec::init((Word2vec *)local_260,ctx);
      Word2vec::train((Word2vec *)local_260,(char *)local_e8,binary,minCount,(real)cbow);
      Word2vec::dump((Word2vec *)local_260,(char *)&lr,(int)tempArg);
      Word2vec::~Word2vec((Word2vec *)local_260);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
//    ProfilerStart("test_capture.prof");
    char trainFile[200];
    trainFile[0] = 0;
    char output[200];
    output[0] = 0;
    int embeddingSize = 128;
    float lr = 0.05;
    int window = 5;
    int cbow = 1;
    int hs = 0;
    int negative = 10;
    int threads = 1;
    int iter = 5;
    int minCount = 5;
    int binary = 0;
    char *tempArg;
    if ((tempArg = parseArg("-size", argc, argv)) != nullptr)
        embeddingSize = atoi(tempArg);
    if ((tempArg = parseArg("-lr", argc, argv)) != nullptr)
        lr = atof(tempArg);
    if ((tempArg = parseArg("-train", argc, argv)) != nullptr)
        strcpy(trainFile, tempArg);
    if ((tempArg = parseArg("-window", argc, argv)) != nullptr)
        window = atoi(tempArg);
    if ((tempArg = parseArg("-cbow", argc, argv)) != nullptr)
        cbow = atoi(tempArg);
    if ((tempArg = parseArg("-hs", argc, argv)) != nullptr)
        hs = atoi(tempArg);
    if ((tempArg = parseArg("-negative", argc, argv)) != nullptr)
        negative = atoi(tempArg);
    if ((tempArg = parseArg("-threads", argc, argv)) != nullptr)
        threads = atoi(tempArg);
    if ((tempArg = parseArg("-iter", argc, argv)) != nullptr)
        iter = atoi(tempArg);
    if ((tempArg = parseArg("-output", argc, argv)) != nullptr)
        strcpy(output, tempArg);
    if ((tempArg = parseArg("-min-count", argc, argv)) != nullptr)
        minCount = atoi(tempArg);
    if ((tempArg = parseArg("-binary", argc, argv)) != nullptr)
        binary = atoi(tempArg);
    if (strlen(trainFile) <= 0)
    {
        printf("no input file\n");
        return 0;
    }
    if (strlen(output) <= 0)
    {
        printf("no output file\n");
        return 0;
    }
    printf("input file: %s\n", trainFile);
    printf("output file: %s\n", output);
    Word2vec word2vec(embeddingSize, cbow, hs, window, negative);
    word2vec.buildVocab(trainFile, minCount);
    word2vec.init();
    word2vec.train(trainFile, iter, threads, lr);
    word2vec.dump(output, binary);
//    ProfilerStop();
}